

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSerialAnalyzer.cpp
# Opt level: O1

void __thiscall SimpleSerialAnalyzer::WorkerThread(SimpleSerialAnalyzer *this)

{
  SimpleSerialAnalyzerResults *pSVar1;
  byte bVar2;
  U32 UVar3;
  int iVar4;
  MarkerType MVar5;
  int iVar6;
  AnalyzerChannelData *pAVar7;
  undefined8 uVar8;
  ulong uVar9;
  byte bVar10;
  Frame frame;
  undefined8 local_58;
  undefined8 local_50;
  ulong local_48;
  undefined1 local_37;
  
  UVar3 = Analyzer::GetSampleRate();
  this->mSampleRateHz = UVar3;
  pAVar7 = (AnalyzerChannelData *)Analyzer::GetAnalyzerChannelData((Channel *)this);
  this->mSerial = pAVar7;
  iVar4 = AnalyzerChannelData::GetBitState();
  if (iVar4 == 0) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  do {
    AnalyzerChannelData::AdvanceToNextEdge();
    uVar8 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerChannelData::Advance((uint)this->mSerial);
    bVar10 = 0x80;
    iVar4 = 8;
    uVar9 = 0;
    do {
      pSVar1 = (this->mResults)._M_t.
               super___uniq_ptr_impl<SimpleSerialAnalyzerResults,_std::default_delete<SimpleSerialAnalyzerResults>_>
               ._M_t.
               super__Tuple_impl<0UL,_SimpleSerialAnalyzerResults_*,_std::default_delete<SimpleSerialAnalyzerResults>_>
               .super__Head_base<0UL,_SimpleSerialAnalyzerResults_*,_false>._M_head_impl;
      MVar5 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerResults::AddMarker((ulonglong)pSVar1,MVar5,(Channel *)0x0);
      iVar6 = AnalyzerChannelData::GetBitState();
      bVar2 = 0;
      if (iVar6 == 1) {
        bVar2 = bVar10;
      }
      uVar9 = (ulong)(byte)((byte)uVar9 | bVar2);
      AnalyzerChannelData::Advance((uint)this->mSerial);
      bVar10 = bVar10 >> 1;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    Frame::Frame((Frame *)&local_58);
    local_37 = 0;
    local_58 = uVar8;
    local_48 = uVar9;
    local_50 = AnalyzerChannelData::GetSampleNumber();
    AnalyzerResults::AddFrame
              ((Frame *)(this->mResults)._M_t.
                        super___uniq_ptr_impl<SimpleSerialAnalyzerResults,_std::default_delete<SimpleSerialAnalyzerResults>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_SimpleSerialAnalyzerResults_*,_std::default_delete<SimpleSerialAnalyzerResults>_>
                        .super__Head_base<0UL,_SimpleSerialAnalyzerResults_*,_false>._M_head_impl);
    AnalyzerResults::CommitResults();
    Analyzer::ReportProgress((ulonglong)this);
    Frame::~Frame((Frame *)&local_58);
  } while( true );
}

Assistant:

void SimpleSerialAnalyzer::WorkerThread()
{
	mSampleRateHz = GetSampleRate();

	mSerial = GetAnalyzerChannelData( mSettings.mInputChannel );

	if( mSerial->GetBitState() == BIT_LOW )
		mSerial->AdvanceToNextEdge();

	U32 samples_per_bit = mSampleRateHz / mSettings.mBitRate;
	U32 samples_to_first_center_of_first_data_bit = U32( 1.5 * double( mSampleRateHz ) / double( mSettings.mBitRate ) );

	for( ; ; )
	{
		U8 data = 0;
		U8 mask = 1 << 7;
		
		mSerial->AdvanceToNextEdge(); //falling edge -- beginning of the start bit

		U64 starting_sample = mSerial->GetSampleNumber();

		mSerial->Advance( samples_to_first_center_of_first_data_bit );

		for( U32 i=0; i<8; i++ )
		{
			//let's put a dot exactly where we sample this bit:
			mResults->AddMarker( mSerial->GetSampleNumber(), AnalyzerResults::Dot, mSettings.mInputChannel );

			if( mSerial->GetBitState() == BIT_HIGH )
				data |= mask;

			mSerial->Advance( samples_per_bit );

			mask = mask >> 1;
		}


		//we have a byte to save. 
		Frame frame;
		frame.mData1 = data;
		frame.mFlags = 0;
		frame.mStartingSampleInclusive = starting_sample;
		frame.mEndingSampleInclusive = mSerial->GetSampleNumber();

		mResults->AddFrame( frame );
		mResults->CommitResults();
		ReportProgress( frame.mEndingSampleInclusive );
	}
}